

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

void __thiscall
antlr::NoViableAltException::NoViableAltException
          (NoViableAltException *this,RefToken *t,string *fileName_)

{
  int iVar1;
  RecognitionException *this_00;
  Token *p;
  string *in_RDX;
  TokenRefCount<antlr::Token> *in_RSI;
  allocator<char> *in_RDI;
  undefined4 in_stack_ffffffffffffff80;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  
  __s = &local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffb0,(char *)__s,in_RDI);
  this_00 = (RecognitionException *)TokenRefCount<antlr::Token>::operator->(in_RSI);
  iVar1 = (*(this_00->super_ANTLRException)._vptr_ANTLRException[3])();
  p = TokenRefCount<antlr::Token>::operator->(in_RSI);
  (*p->_vptr_Token[2])();
  RecognitionException::RecognitionException
            (this_00,local_18,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
             (int)((ulong)p >> 0x20),(int)p);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)in_RDI = &PTR__NoViableAltException_00482a48;
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
             (TokenRefCount<antlr::Token> *)p);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)CONCAT44(iVar1,in_stack_ffffffffffffff80),(AST *)p);
  return;
}

Assistant:

NoViableAltException::NoViableAltException(
	RefToken t,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("NoViableAlt",fileName_,t->getLine(),t->getColumn()),
    token(t), node(nullASTptr)
{
}